

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression_suite.cpp
# Opt level: O1

void double_suite::test_exponential_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  double *in_stack_ffffffffffffff18;
  double local_e0;
  value_type local_d8;
  regression<double,_4UL> filter;
  
  memset(&filter,0,0xa0);
  trial::online::interim::regression<double,_4UL>::push(&filter,1.0,1.0);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 0.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x15a,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,predicate
            );
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = 1.0;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x15b,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_00);
  trial::online::interim::regression<double,_4UL>::push(&filter,10.0,10.0);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 1.0;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x15e,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_01);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = 0.0;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x15f,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_02);
  trial::online::interim::regression<double,_4UL>::push(&filter,100.0,100.0);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 1.0;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x162,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_03);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = 0.0;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x163,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_04);
  trial::online::interim::regression<double,_4UL>::push(&filter,1000.0,1000.0);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 1.0;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x166,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_05);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = 0.0;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x167,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_06);
  trial::online::interim::regression<double,_4UL>::push(&filter,10000.0,10000.0);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 1.0;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x16c,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_07);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = 0.0;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x16d,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_08);
  trial::online::interim::regression<double,_4UL>::push(&filter,100000.0,100000.0);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 1.0;
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x170,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_09);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = 0.0;
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x171,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_10);
  trial::online::interim::regression<double,_4UL>::push(&filter,1000000.0,1000000.0);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 1.0;
  predicate_11.absolute = 2.2250738585072014e-308;
  predicate_11.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x174,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_11);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = 0.0;
  predicate_12.absolute = 2.2250738585072014e-308;
  predicate_12.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x175,0x1086ce,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_12);
  return;
}

Assistant:

void test_linear_increase_slope_2()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    interim::regression<double, 4> filter;

    filter.push(0.0, 0.0);
    TRIAL_TEST_WITH(filter.slope(), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);

    filter.push(1.0, 2.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(1.0), 2.0, tolerance);

    filter.push(2.0, 4.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(2.0), 4.0, tolerance);

    filter.push(3.0, 6.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(3.0), 6.0, tolerance);

    // Window full

    filter.push(4.0, 8.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(4.0), 8.0, tolerance);

    filter.push(5.0, 10.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(5.0), 10.0, tolerance);

    filter.push(6.0, 12.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(6.0), 12.0, tolerance);

    filter.push(7.0, 14.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(7.0), 14.0, tolerance);

    filter.push(8.0, 16.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(8.0), 16.0, tolerance);
}